

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_part_file.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::posix_part_file::posix_part_file
          (posix_part_file *this,string *path,string *name,int num_pieces,int piece_size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pcVar4;
  iterator __position;
  undefined8 uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  mapped_type *pmVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  file_pointer f;
  vector<bool,_slot_index_t> free_slots;
  vector<char,_std::allocator<char>_> header;
  error_code ec;
  key_type local_9c;
  vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
  *local_98;
  undefined1 local_90 [8];
  vector<bool,_std::allocator<bool>_> local_88;
  undefined1 local_60 [16];
  pointer local_50;
  pointer local_48;
  int local_40;
  char local_3c;
  system_error_category *local_38;
  
  paVar1 = &(this->m_path).field_2;
  (this->m_path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (path->_M_dataplus)._M_p;
  paVar2 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&path->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_path).field_2 + 8) = uVar5;
  }
  else {
    (this->m_path)._M_dataplus._M_p = pcVar4;
    (this->m_path).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_path)._M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar2;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->m_name).field_2 + 8) = uVar5;
  }
  else {
    (this->m_name)._M_dataplus._M_p = pcVar4;
    (this->m_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->m_name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  *(undefined8 *)
   ((long)&(this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_free_slots).
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->m_free_slots).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_free_slots).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_max_pieces = num_pieces;
  this->m_piece_size = piece_size;
  this->m_header_size = num_pieces * 4 + 0x407U & 0xfffffc00;
  this->m_dirty_metadata = false;
  local_60._0_8_ = &this->m_piece_map;
  (this->m_piece_map)._M_h._M_buckets = &(this->m_piece_map)._M_h._M_single_bucket;
  (this->m_piece_map)._M_h._M_bucket_count = 1;
  (this->m_piece_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_piece_map)._M_h._M_element_count = 0;
  (this->m_piece_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_piece_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_piece_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_40 = 0;
  local_3c = '\0';
  local_38 = &boost::system::detail::cat_holder<void>::system_category_instance;
  open_file((posix_part_file *)local_90,(open_mode)this,(error_code *)0x0);
  if (local_3c == '\0') {
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(local_60 + 8),(long)this->m_header_size,
               (allocator_type *)&local_88);
    sVar7 = fread((void *)local_60._8_8_,1,(long)local_50 - local_60._8_8_,(FILE *)local_90);
    uVar5 = local_60._8_8_;
    if (sVar7 == (long)local_50 - local_60._8_8_) {
      if ((ulong)(long)this->m_header_size <= sVar7) {
        lVar12 = 0;
        uVar6 = 0;
        do {
          uVar6 = (uint)*(byte *)(local_60._8_8_ + lVar12) | uVar6 << 8;
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 != 4);
        lVar12 = 0;
        uVar11 = 0;
        do {
          uVar11 = (uint)*(byte *)(local_60._8_8_ + 4 + lVar12) | uVar11 << 8;
          lVar12 = lVar12 + 1;
        } while ((int)lVar12 != 4);
        if ((uVar6 == num_pieces) && (this->m_piece_size == uVar11)) {
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
          local_98 = (vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                      *)&this->m_free_slots;
          ::std::vector<bool,_std::allocator<bool>_>::resize(&local_88,(long)num_pieces,true);
          local_9c.m_val = 0;
          if (0 < num_pieces) {
            lVar12 = uVar5 + 8;
            do {
              lVar8 = 0;
              uVar6 = 0;
              do {
                uVar11 = uVar6;
                bVar3 = *(byte *)(lVar12 + lVar8);
                uVar6 = (uint)bVar3 | uVar11 << 8;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 != 4);
              if ((int)uVar6 < num_pieces && -1 < (int)(uVar11 << 8)) {
                if ((this->m_num_allocated).m_val <= (int)uVar6) {
                  (this->m_num_allocated).m_val = uVar6 + 1;
                }
                bVar3 = bVar3 & 0x3f;
                local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
                     local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] &
                     (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                pmVar9 = ::std::__detail::
                         _Map_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)local_60._0_8_,&local_9c);
                pmVar9->m_val = uVar6;
              }
              lVar12 = lVar12 + 4;
              local_9c.m_val = local_9c.m_val + 1;
            } while (local_9c.m_val < num_pieces);
          }
          local_9c.m_val = 0;
          if (0 < (this->m_num_allocated).m_val) {
            do {
              uVar13 = (ulong)local_9c.m_val;
              uVar14 = uVar13 + 0x3f;
              if (-1 < (long)uVar13) {
                uVar14 = uVar13;
              }
              if ((local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar14 >> 6) +
                    ((ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                   (uVar13 & 0x3f) & 1) != 0) {
                __position._M_current =
                     (this->m_free_slots).
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->m_free_slots).
                    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  ::std::
                  vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>>>
                  ::
                  _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::slot_index_tag_t,void>const&>
                            (local_98,__position,
                             (strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void> *)
                             &local_9c);
                }
                else {
                  (__position._M_current)->m_val = local_9c.m_val;
                  (this->m_free_slots).
                  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
              }
              local_9c.m_val = local_9c.m_val + 1;
            } while (local_9c.m_val < (this->m_num_allocated).m_val);
          }
          if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage -
                            (long)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
          }
        }
      }
    }
    else {
      piVar10 = __errno_location();
      local_40 = *piVar10;
      local_3c = local_40 != 0;
      local_38 = (system_error_category *)
                 &boost::system::detail::cat_holder<void>::generic_category_instance;
    }
    if ((void *)local_60._8_8_ != (void *)0x0) {
      operator_delete((void *)local_60._8_8_,(long)local_48 - local_60._8_8_);
    }
  }
  if (local_90 != (undefined1  [8])0x0) {
    fclose((FILE *)local_90);
  }
  return;
}

Assistant:

posix_part_file::posix_part_file(std::string path, std::string name
		, int const num_pieces, int const piece_size)
		: m_path(std::move(path))
		, m_name(std::move(name))
		, m_max_pieces(num_pieces)
		, m_piece_size(piece_size)
		, m_header_size(round_up((2 + num_pieces) * 4))
	{
		TORRENT_ASSERT(num_pieces > 0);
		TORRENT_ASSERT(m_piece_size > 0);

		error_code ec;
		auto f = open_file(open_mode::read_only, ec);
		if (ec) return;

		// parse header
		std::vector<char> header(static_cast<std::size_t>(m_header_size));
		auto const n = std::fread(header.data(), 1, header.size(), f.file());
		if (std::size_t(n) != header.size())
		{
			ec.assign(errno, generic_category());
			return;
		}

		// we don't have a full header. consider the file empty
		if (n < std::size_t(m_header_size)) return;
		using namespace libtorrent::aux;

		char* ptr = header.data();
		// we have a header. Parse it
		int const num_pieces_ = int(read_uint32(ptr));
		int const piece_size_ = int(read_uint32(ptr));

		// if there is a mismatch in number of pieces or piece size
		// consider the file empty and overwrite anything in there
		if (num_pieces != num_pieces_ || m_piece_size != piece_size_) return;

		// this is used to determine which slots are free, and how many
		// slots are allocated
		aux::vector<bool, slot_index_t> free_slots;
		free_slots.resize(num_pieces, true);

		for (auto i = piece_index_t(0); i < piece_index_t(num_pieces); ++i)
		{
			slot_index_t const slot(read_int32(ptr));
			if (static_cast<int>(slot) < 0) continue;

			// invalid part-file
			TORRENT_ASSERT(slot < slot_index_t(num_pieces));
			if (slot >= slot_index_t(num_pieces)) continue;

			if (slot >= m_num_allocated)
				m_num_allocated = next(slot);

			free_slots[slot] = false;
			m_piece_map[i] = slot;
		}

		// now, populate the free_list with the "holes"
		for (slot_index_t i(0); i < m_num_allocated; ++i)
		{
			if (free_slots[i]) m_free_slots.push_back(i);
		}
	}